

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O2

ngx_int_t ngx_radix32tree_delete(ngx_radix_tree_t *tree,uint32_t key,uint32_t mask)

{
  ngx_radix_node_t **ppnVar1;
  ngx_radix_node_t *pnVar2;
  uint uVar3;
  ngx_int_t nVar4;
  ngx_radix_tree_t *pnVar5;
  ngx_radix_node_t *pnVar6;
  ngx_radix_node_t *pnVar7;
  ngx_radix_node_t *pnVar8;
  
  pnVar5 = tree;
  for (uVar3 = 0x80000000;
      (pnVar2 = pnVar5->root, pnVar2 != (ngx_radix_node_t *)0x0 && ((uVar3 & mask) != 0));
      uVar3 = uVar3 >> 1) {
    pnVar5 = (ngx_radix_tree_t *)(&pnVar2->right + ((uVar3 & key) == 0));
  }
  nVar4 = -1;
  if (pnVar2 != (ngx_radix_node_t *)0x0) {
    if ((pnVar2->right == (ngx_radix_node_t *)0x0) && (pnVar2->left == (ngx_radix_node_t *)0x0)) {
      pnVar7 = tree->free;
      pnVar8 = pnVar2->parent;
      do {
        pnVar6 = pnVar2;
        (&pnVar8->right)[pnVar8->right != pnVar6] = (ngx_radix_node_t *)0x0;
        pnVar6->right = pnVar7;
        if (((pnVar8->right != (ngx_radix_node_t *)0x0) || (pnVar8->left != (ngx_radix_node_t *)0x0)
            ) || (pnVar8->value != 0xffffffffffffffff)) break;
        ppnVar1 = &pnVar8->parent;
        pnVar2 = pnVar8;
        pnVar7 = pnVar6;
        pnVar8 = *ppnVar1;
      } while (*ppnVar1 != (ngx_radix_node_t *)0x0);
      tree->free = pnVar6;
    }
    else {
      if (pnVar2->value == 0xffffffffffffffff) {
        return -1;
      }
      pnVar2->value = 0xffffffffffffffff;
    }
    nVar4 = 0;
  }
  return nVar4;
}

Assistant:

ngx_int_t
ngx_radix32tree_delete(ngx_radix_tree_t *tree, uint32_t key, uint32_t mask)
{
    uint32_t           bit;
    ngx_radix_node_t  *node;

    bit = 0x80000000;
    node = tree->root;

    while (node && (bit & mask)) {
        if (key & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;
    }

    if (node == NULL) {
        return NGX_ERROR;
    }

    if (node->right || node->left) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            node->value = NGX_RADIX_NO_VALUE;
            return NGX_OK;
        }

        return NGX_ERROR;
    }

    for ( ;; ) {
        if (node->parent->right == node) {
            node->parent->right = NULL;

        } else {
            node->parent->left = NULL;
        }

        node->right = tree->free;
        tree->free = node;

        node = node->parent;

        if (node->right || node->left) {
            break;
        }

        if (node->value != NGX_RADIX_NO_VALUE) {
            break;
        }

        if (node->parent == NULL) {
            break;
        }
    }

    return NGX_OK;
}